

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2DataBuilder::Normalizer2DataBuilder
          (Normalizer2DataBuilder *this,UErrorCode *errorCode)

{
  Norms::Norms(&this->norms,errorCode);
  this->phase = 0;
  this->overrideHandling = OVERRIDE_PREVIOUS;
  this->optimization = OPTIMIZE_NORMAL;
  this->norm16TrieBytes = (uint8_t *)0x0;
  this->norm16TrieLength = 0;
  (this->extraData).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003bf258;
  (this->extraData).fUnion.fStackFields.fLengthAndFlags = 2;
  this->indexes[0] = 0;
  this->indexes[1] = 0;
  this->indexes[2] = 0;
  this->indexes[3] = 0;
  this->indexes[4] = 0;
  this->indexes[5] = 0;
  this->indexes[6] = 0;
  this->indexes[7] = 0;
  this->indexes[8] = 0;
  this->indexes[9] = 0;
  this->indexes[10] = 0;
  this->indexes[0xb] = 0;
  this->indexes[0xc] = 0;
  this->indexes[0xd] = 0;
  this->indexes[0xe] = 0;
  this->indexes[0xf] = 0;
  this->indexes[0x10] = 0;
  this->indexes[0x11] = 0;
  this->indexes[0x12] = 0;
  this->indexes[0x13] = 0;
  memset(this->smallFCD,0,0x104);
  return;
}

Assistant:

Normalizer2DataBuilder::Normalizer2DataBuilder(UErrorCode &errorCode) :
        norms(errorCode),
        phase(0), overrideHandling(OVERRIDE_PREVIOUS), optimization(OPTIMIZE_NORMAL),
        norm16TrieBytes(nullptr), norm16TrieLength(0) {
    memset(unicodeVersion, 0, sizeof(unicodeVersion));
    memset(indexes, 0, sizeof(indexes));
    memset(smallFCD, 0, sizeof(smallFCD));
}